

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void read_vec_element(DisasContext_conflict1 *s,TCGv_i64 tcg_dest,int srcidx,int element,MemOp memop
                     )

{
  TCGContext_conflict1 *tcg_ctx;
  int iVar1;
  TCGv_ptr a2;
  TCGOpcode TStack_8;
  
  if (memop < MO_BE) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar1 = (element << ((byte)memop & 3)) + srcidx * 0x100 + 0xc10;
    switch(memop) {
    case MO_8:
      a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
      TStack_8 = INDEX_op_ld8u_i64;
      break;
    case MO_16:
      tcg_gen_ld16u_i64_aarch64(tcg_ctx,tcg_dest,tcg_ctx->cpu_env,(long)iVar1);
      return;
    case MO_32:
      tcg_gen_ld32u_i64_aarch64(tcg_ctx,tcg_dest,tcg_ctx->cpu_env,(long)iVar1);
      return;
    default:
      tcg_gen_ld_i64_aarch64(tcg_ctx,tcg_dest,tcg_ctx->cpu_env,(long)iVar1);
      return;
    case MO_ASHIFT:
      a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
      TStack_8 = INDEX_op_ld8s_i64;
      break;
    case MO_LESW:
      a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
      TStack_8 = INDEX_op_ld16s_i64;
      break;
    case MO_LESL:
      a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
      TStack_8 = INDEX_op_ld32s_i64;
    }
    tcg_gen_op3_aarch64(tcg_ctx,TStack_8,(TCGArg)(tcg_dest + (long)tcg_ctx),(TCGArg)a2,(long)iVar1);
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
             ,0x419,(char *)0x0);
}

Assistant:

static void read_vec_element(DisasContext *s, TCGv_i64 tcg_dest, int srcidx,
                             int element, MemOp memop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int vect_off = vec_reg_offset(s, srcidx, element, memop & MO_SIZE);
    switch (memop) {
    case MO_8:
        tcg_gen_ld8u_i64(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_16:
        tcg_gen_ld16u_i64(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_32:
        tcg_gen_ld32u_i64(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_8|MO_SIGN:
        tcg_gen_ld8s_i64(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_16|MO_SIGN:
        tcg_gen_ld16s_i64(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_32|MO_SIGN:
        tcg_gen_ld32s_i64(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_64:
    case MO_64|MO_SIGN:
        tcg_gen_ld_i64(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    default:
        g_assert_not_reached();
    }
}